

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhi.cpp
# Opt level: O0

void __thiscall
QRhiResourceUpdateBatch::uploadStaticBuffer
          (QRhiResourceUpdateBatch *this,QRhiBuffer *buf,void *data)

{
  long lVar1;
  quint32 qVar2;
  size_type sVar3;
  QVarLengthArray<QRhiResourceUpdateBatchPrivate::BufferOp,_64LL> *this_00;
  QRhiBuffer *buf_00;
  QRhiBuffer *in_RSI;
  BufferOp *in_RDI;
  long in_FS_OFFSET;
  int idx;
  BufferOp *in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffffa8;
  int iVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  qVar2 = QRhiBuffer::size(in_RSI);
  if (qVar2 != 0) {
    iVar4 = **(int **)in_RDI;
    **(int **)in_RDI = iVar4 + 1;
    buf_00 = (QRhiBuffer *)(long)iVar4;
    sVar3 = QVLABaseBase::size((QVLABaseBase *)(*(long *)in_RDI + 8));
    if ((long)buf_00 < sVar3) {
      QVLABase<QRhiResourceUpdateBatchPrivate::BufferOp>::operator[]
                ((QVLABase<QRhiResourceUpdateBatchPrivate::BufferOp> *)in_stack_ffffffffffffff88,
                 0x6963d0);
      QRhiResourceUpdateBatchPrivate::BufferOp::changeToStaticUpload
                (in_RDI,buf_00,(quint32)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                 (quint32)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    }
    else {
      this_00 = (QVarLengthArray<QRhiResourceUpdateBatchPrivate::BufferOp,_64LL> *)
                (*(long *)in_RDI + 8);
      QRhiResourceUpdateBatchPrivate::BufferOp::staticUpload
                ((QRhiBuffer *)CONCAT44(iVar4,in_stack_ffffffffffffffa8),
                 (quint32)((ulong)in_RDI >> 0x20),(quint32)in_RDI,buf_00);
      QVarLengthArray<QRhiResourceUpdateBatchPrivate::BufferOp,_64LL>::append
                (this_00,in_stack_ffffffffffffff88);
      QRhiResourceUpdateBatchPrivate::BufferOp::~BufferOp((BufferOp *)0x69642a);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QRhiResourceUpdateBatch::uploadStaticBuffer(QRhiBuffer *buf, const void *data)
{
    if (buf->size() > 0) {
        const int idx = d->activeBufferOpCount++;
        if (idx < d->bufferOps.size())
            QRhiResourceUpdateBatchPrivate::BufferOp::changeToStaticUpload(&d->bufferOps[idx], buf, 0, 0, data);
        else
            d->bufferOps.append(QRhiResourceUpdateBatchPrivate::BufferOp::staticUpload(buf, 0, 0, data));
    }
}